

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O0

string * FindPTypes_abi_cxx11_(string *__return_storage_ptr__,aiScene *scene)

{
  char *pcVar1;
  bool bVar2;
  allocator<char> local_9d [19];
  byte local_8a;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint local_24;
  uint local_20;
  uint pt;
  uint i;
  bool haveit [4];
  aiScene *scene_local;
  
  _i = scene;
  memset(&pt,0,4);
  for (local_20 = 0; local_20 < _i->mNumMeshes; local_20 = local_20 + 1) {
    local_24 = _i->mMeshes[local_20]->mPrimitiveTypes;
    if ((local_24 & 1) != 0) {
      pt._0_1_ = 1;
    }
    if ((local_24 & 2) != 0) {
      pt._1_1_ = 1;
    }
    if ((local_24 & 4) != 0) {
      pt._2_1_ = 1;
    }
    if ((local_24 & 8) != 0) {
      pt._3_1_ = 1;
    }
  }
  local_8a = 0;
  bVar2 = ((byte)pt & 1) == 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",local_9d);
  }
  else {
    std::allocator<char>::allocator();
    local_8a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"points",&local_89);
  }
  pcVar1 = "";
  if ((pt._1_1_ & 1) != 0) {
    pcVar1 = "lines";
  }
  std::operator+(&local_68,&local_88,pcVar1);
  pcVar1 = "";
  if ((pt._2_1_ & 1) != 0) {
    pcVar1 = "triangles";
  }
  std::operator+(&local_48,&local_68,pcVar1);
  pcVar1 = "";
  if ((pt._3_1_ & 1) != 0) {
    pcVar1 = "n-polygons";
  }
  std::operator+(__return_storage_ptr__,&local_48,pcVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar2) {
    std::allocator<char>::~allocator(local_9d);
  }
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator(&local_89);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FindPTypes(const aiScene* scene)
{
	bool haveit[4] = {0};
	for(unsigned int i = 0; i < scene->mNumMeshes; ++i) {
		const unsigned int pt = scene->mMeshes[i]->mPrimitiveTypes;
		if (pt & aiPrimitiveType_POINT) {
			haveit[0]=true;
		}
		if (pt & aiPrimitiveType_LINE) {
			haveit[1]=true;
		}
		if (pt & aiPrimitiveType_TRIANGLE) {
			haveit[2]=true;
		}
		if (pt & aiPrimitiveType_POLYGON) {
			haveit[3]=true;
		}
	}
	return (haveit[0]?std::string("points"):"")+(haveit[1]?"lines":"")+
		(haveit[2]?"triangles":"")+(haveit[3]?"n-polygons":"");
}